

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

size_t ggml_quantize_chunk(ggml_type type,float *src,void *dst,int64_t start,int64_t nrows,
                          int64_t n_per_row,float *imatrix)

{
  _Bool _Var1;
  float *src_00;
  float *src_01;
  void *dst_00;
  float *quant_weights;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  ggml_type in_EDI;
  long in_R8;
  long in_R9;
  long in_stack_00000008;
  size_t elemsize_2;
  size_t elemsize_1;
  size_t elemsize;
  size_t result;
  size_t row_size;
  size_t start_row;
  int64_t n;
  float *in_stack_000000b8;
  int64_t in_stack_000000c0;
  int64_t in_stack_000000c8;
  void *in_stack_000000d0;
  float *in_stack_000000d8;
  float *in_stack_000000f8;
  int64_t in_stack_00000100;
  int64_t in_stack_00000108;
  void *in_stack_00000110;
  float *in_stack_00000118;
  float *in_stack_00000198;
  int64_t in_stack_000001a0;
  int64_t in_stack_000001a8;
  void *in_stack_000001b0;
  float *in_stack_000001b8;
  float *in_stack_000001d8;
  int64_t in_stack_000001e0;
  int64_t in_stack_000001e8;
  void *in_stack_000001f0;
  float *in_stack_000001f8;
  float *in_stack_000002c8;
  int64_t in_stack_000002d0;
  int64_t in_stack_000002d8;
  void *in_stack_000002e0;
  float *in_stack_000002e8;
  int64_t in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  ggml_type type_00;
  ggml_fp16_t *in_stack_ffffffffffffff98;
  float *in_stack_ffffffffffffffa0;
  long lVar2;
  ggml_bf16_t *in_stack_ffffffffffffffa8;
  size_t __n;
  
  type_00 = (ggml_type)((ulong)in_stack_ffffffffffffff90 >> 0x20);
  src_00 = (float *)(in_R8 * in_R9);
  _Var1 = ggml_quantize_requires_imatrix(in_EDI);
  if ((_Var1) && (in_stack_00000008 == 0)) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
               0x192e,"GGML_ASSERT(%s) failed","imatrix != NULL");
  }
  if (in_RCX % type_traits[in_EDI].blck_size != 0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
               0x1931,"GGML_ASSERT(%s) failed","start % type_traits[type].blck_size == 0");
  }
  if (in_RCX % in_R9 == 0) {
    ggml_quantize_init(GGML_TYPE_F32);
    src_01 = (float *)(in_RCX / in_R9);
    dst_00 = (void *)ggml_row_size(type_00,in_stack_ffffffffffffff88);
    __n = 0;
    quant_weights = (float *)(ulong)in_EDI;
    switch(quant_weights) {
    case (float *)0x0:
      __n = (long)src_00 * 4;
      memcpy((void *)(in_RDX + in_RCX * 4),(void *)(in_RSI + in_RCX * 4),__n);
      break;
    case (float *)0x1:
      lVar2 = 2;
      ggml_fp32_to_fp16_row
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,(int64_t)quant_weights);
      __n = (long)src_00 * lVar2;
      break;
    case (float *)0x2:
      __n = quantize_q4_0(src_00,src_01,(int64_t)dst_00,0,(float *)in_stack_ffffffffffffffa8);
      break;
    case (float *)0x3:
      __n = quantize_q4_1(src_00,src_01,(int64_t)dst_00,0,(float *)in_stack_ffffffffffffffa8);
      break;
    default:
      break;
    case (float *)0x6:
      __n = quantize_q5_0(src_00,src_01,(int64_t)dst_00,0,(float *)in_stack_ffffffffffffffa8);
      break;
    case (float *)0x7:
      __n = quantize_q5_1(src_00,src_01,(int64_t)dst_00,0,(float *)in_stack_ffffffffffffffa8);
      break;
    case (float *)0x8:
      __n = quantize_q8_0((float *)0x0,in_stack_ffffffffffffffa8,(int64_t)in_stack_ffffffffffffffa0,
                          (int64_t)in_stack_ffffffffffffff98,quant_weights);
      break;
    case (float *)0xa:
      __n = quantize_q2_K(src_01,dst_00,0,(int64_t)in_stack_ffffffffffffffa8,
                          in_stack_ffffffffffffffa0);
      break;
    case (float *)0xb:
      __n = quantize_q3_K(src_01,dst_00,0,(int64_t)in_stack_ffffffffffffffa8,
                          in_stack_ffffffffffffffa0);
      break;
    case (float *)0xc:
      __n = quantize_q4_K(src_01,dst_00,0,(int64_t)in_stack_ffffffffffffffa8,
                          in_stack_ffffffffffffffa0);
      break;
    case (float *)0xd:
      __n = quantize_q5_K(src_01,dst_00,0,(int64_t)in_stack_ffffffffffffffa8,
                          in_stack_ffffffffffffffa0);
      break;
    case (float *)0xe:
      __n = quantize_q6_K(src_01,dst_00,0,(int64_t)in_stack_ffffffffffffffa8,
                          in_stack_ffffffffffffffa0);
      break;
    case (float *)0x10:
      __n = quantize_iq2_xxs(src_01,dst_00,0,(int64_t)in_stack_ffffffffffffffa8,
                             in_stack_ffffffffffffffa0);
      break;
    case (float *)0x11:
      __n = quantize_iq2_xs(src_01,dst_00,0,(int64_t)in_stack_ffffffffffffffa8,
                            in_stack_ffffffffffffffa0);
      break;
    case (float *)0x12:
      __n = quantize_iq3_xxs(src_01,dst_00,0,(int64_t)in_stack_ffffffffffffffa8,
                             in_stack_ffffffffffffffa0);
      break;
    case (float *)0x13:
      __n = quantize_iq1_s(in_stack_000002e8,in_stack_000002e0,in_stack_000002d8,in_stack_000002d0,
                           in_stack_000002c8);
      break;
    case (float *)0x14:
      __n = quantize_iq4_nl(in_stack_000000d8,in_stack_000000d0,in_stack_000000c8,in_stack_000000c0,
                            in_stack_000000b8);
      break;
    case (float *)0x15:
      __n = quantize_iq3_s(in_stack_000001f8,in_stack_000001f0,in_stack_000001e8,in_stack_000001e0,
                           in_stack_000001d8);
      break;
    case (float *)0x16:
      __n = quantize_iq2_s(src_01,dst_00,0,(int64_t)in_stack_ffffffffffffffa8,
                           in_stack_ffffffffffffffa0);
      break;
    case (float *)0x17:
      __n = quantize_iq4_xs(in_stack_000001b8,in_stack_000001b0,in_stack_000001a8,in_stack_000001a0,
                            in_stack_00000198);
      break;
    case (float *)0x1d:
      __n = quantize_iq1_m(in_stack_00000118,in_stack_00000110,in_stack_00000108,in_stack_00000100,
                           in_stack_000000f8);
      break;
    case (float *)0x1e:
      lVar2 = 2;
      ggml_fp32_to_bf16_row_ref((float *)0x0,in_stack_ffffffffffffffa8,2);
      __n = (long)src_00 * lVar2;
      break;
    case (float *)0x22:
      __n = quantize_tq1_0((float *)0x0,in_stack_ffffffffffffffa8,(int64_t)in_stack_ffffffffffffffa0
                           ,(int64_t)in_stack_ffffffffffffff98,quant_weights);
      break;
    case (float *)0x23:
      __n = quantize_tq2_0((float *)0x0,in_stack_ffffffffffffffa8,(int64_t)in_stack_ffffffffffffffa0
                           ,(int64_t)in_stack_ffffffffffffff98,quant_weights);
    }
    if (__n != in_R8 * (long)dst_00) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
                 0x1967,"GGML_ASSERT(%s) failed","result == nrows * row_size");
    }
    return __n;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",0x1932,
             "GGML_ASSERT(%s) failed","start % n_per_row == 0");
}

Assistant:

size_t ggml_quantize_chunk(
        enum ggml_type   type,
           const float * src,
                  void * dst,
               int64_t   start,
               int64_t   nrows,
               int64_t   n_per_row,
           const float * imatrix) {
    const int64_t n = (int64_t) nrows * n_per_row;

    if (ggml_quantize_requires_imatrix(type)) {
        GGML_ASSERT(imatrix != NULL);
    }

    GGML_ASSERT(start % type_traits[type].blck_size == 0);
    GGML_ASSERT(start % n_per_row == 0);

    ggml_quantize_init(type); // this is noop if already initialized

    const size_t start_row = start / n_per_row;
    const size_t row_size  = ggml_row_size(type, n_per_row);

    size_t result = 0;

    switch (type) {
        case GGML_TYPE_Q4_0:    result = quantize_q4_0(src + start, (char *) dst + start_row * row_size, nrows, n_per_row, imatrix); break;
        case GGML_TYPE_Q4_1:    result = quantize_q4_1(src + start, (char *) dst + start_row * row_size, nrows, n_per_row, imatrix); break;
        case GGML_TYPE_Q5_0:    result = quantize_q5_0(src + start, (char *) dst + start_row * row_size, nrows, n_per_row, imatrix); break;
        case GGML_TYPE_Q5_1:    result = quantize_q5_1(src + start, (char *) dst + start_row * row_size, nrows, n_per_row, imatrix); break;
        case GGML_TYPE_Q8_0:    result = quantize_q8_0(src + start, (char *) dst + start_row * row_size, nrows, n_per_row, imatrix); break;
        case GGML_TYPE_Q2_K:    result = quantize_q2_K(src + start, (char *) dst + start_row * row_size, nrows, n_per_row, imatrix); break;
        case GGML_TYPE_Q3_K:    result = quantize_q3_K(src + start, (char *) dst + start_row * row_size, nrows, n_per_row, imatrix); break;
        case GGML_TYPE_Q4_K:    result = quantize_q4_K(src + start, (char *) dst + start_row * row_size, nrows, n_per_row, imatrix); break;
        case GGML_TYPE_Q5_K:    result = quantize_q5_K(src + start, (char *) dst + start_row * row_size, nrows, n_per_row, imatrix); break;
        case GGML_TYPE_Q6_K:    result = quantize_q6_K(src + start, (char *) dst + start_row * row_size, nrows, n_per_row, imatrix); break;
        case GGML_TYPE_TQ1_0:   result = quantize_tq1_0(src + start, (char *) dst + start_row * row_size, nrows, n_per_row, imatrix); break;
        case GGML_TYPE_TQ2_0:   result = quantize_tq2_0(src + start, (char *) dst + start_row * row_size, nrows, n_per_row, imatrix); break;
        case GGML_TYPE_IQ2_XXS: result = quantize_iq2_xxs(src + start, (char *) dst + start_row * row_size, nrows, n_per_row, imatrix); break;
        case GGML_TYPE_IQ2_XS:  result = quantize_iq2_xs (src + start, (char *) dst + start_row * row_size, nrows, n_per_row, imatrix); break;
        case GGML_TYPE_IQ3_XXS: result = quantize_iq3_xxs(src + start, (char *) dst + start_row * row_size, nrows, n_per_row, imatrix); break;
        case GGML_TYPE_IQ3_S:   result = quantize_iq3_s  (src + start, (char *) dst + start_row * row_size, nrows, n_per_row, imatrix); break;
        case GGML_TYPE_IQ2_S:   result = quantize_iq2_s  (src + start, (char *) dst + start_row * row_size, nrows, n_per_row, imatrix); break;
        case GGML_TYPE_IQ1_S:   result = quantize_iq1_s  (src + start, (char *) dst + start_row * row_size, nrows, n_per_row, imatrix); break;
        case GGML_TYPE_IQ1_M:   result = quantize_iq1_m  (src + start, (char *) dst + start_row * row_size, nrows, n_per_row, imatrix); break;
        case GGML_TYPE_IQ4_NL:  result = quantize_iq4_nl (src + start, (char *) dst + start_row * row_size, nrows, n_per_row, imatrix); break;
        case GGML_TYPE_IQ4_XS:  result = quantize_iq4_xs (src + start, (char *) dst + start_row * row_size, nrows, n_per_row, imatrix); break;
        case GGML_TYPE_F16:
            {
                size_t elemsize = sizeof(ggml_fp16_t);
                ggml_fp32_to_fp16_row(src + start, (ggml_fp16_t *)dst + start, n);
                result = n * elemsize;
            } break;
        case GGML_TYPE_BF16:
            {
                size_t elemsize = sizeof(ggml_bf16_t);
                ggml_fp32_to_bf16_row_ref(src + start, (ggml_bf16_t *)dst + start, n);
                result = n * elemsize;
            } break;
        case GGML_TYPE_F32:
            {
                size_t elemsize = sizeof(float);
                result = n * elemsize;
                memcpy((uint8_t *)dst + start * elemsize, src + start, result);
            } break;
        default:
            assert(false);
    }

    GGML_ASSERT(result == nrows * row_size);

    return result;
}